

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

PixelBufferAccess * __thiscall
vkt::pipeline::TestTextureCubeArray::getLevel
          (PixelBufferAccess *__return_storage_ptr__,TestTextureCubeArray *this,int level,int layer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  PixelBufferAccess *pPVar5;
  TextureFormat *pTVar6;
  void *pvVar7;
  deUint32 layerOffset;
  deUint32 layerSize;
  PixelBufferAccess levelLayers;
  int layer_local;
  int level_local;
  TestTextureCubeArray *this_local;
  
  levelLayers.super_ConstPixelBufferAccess.m_data._0_4_ = layer;
  levelLayers.super_ConstPixelBufferAccess.m_data._4_4_ = level;
  pPVar5 = tcu::TextureLevelPyramid::getLevel(&(this->m_texture).super_TextureLevelPyramid,level);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&layerOffset,pPVar5);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&layerOffset);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&layerOffset);
  pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&layerOffset);
  iVar3 = tcu::TextureFormat::getPixelSize(pTVar6);
  uVar4 = iVar1 * iVar2 * iVar3 * (int)levelLayers.super_ConstPixelBufferAccess.m_data;
  pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&layerOffset);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&layerOffset);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&layerOffset);
  pvVar7 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&layerOffset);
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,pTVar6,iVar1,iVar2,1,(void *)((long)pvVar7 + (ulong)uVar4));
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess TestTextureCubeArray::getLevel (int level, int layer)
{
	const tcu::PixelBufferAccess	levelLayers	= m_texture.getLevel(level);
	const deUint32					layerSize	= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();
	const deUint32					layerOffset	= layerSize * layer;

	return tcu::PixelBufferAccess(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
}